

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Monthly.cpp
# Opt level: O2

bool __thiscall RenX_Ladder_Monthly_TimePlugin::initialize(RenX_Ladder_Monthly_TimePlugin *this)

{
  undefined1 *this_00;
  LadderDatabase *pLVar1;
  bool bVar2;
  undefined8 uVar3;
  tm *ptVar4;
  string_view in_key;
  string_view in_key_00;
  time_t current_time;
  
  current_time = time((time_t *)0x0);
  pLVar1 = &this->database;
  this_00 = &this->field_0x38;
  uVar3 = Jupiter::Config::get(this_00,0xe,"LadderDatabase",0x11,"Ladder.Monthly.db");
  Jupiter::Database::process_file(pLVar1,uVar3);
  uVar3 = Jupiter::Config::get(this_00,0xc,"DatabaseName",7,"Monthly");
  RenX::LadderDatabase::setName(pLVar1,uVar3);
  in_key._M_str = "OutputTimes";
  in_key._M_len = 0xb;
  Jupiter::Config::get<bool>((Config *)this_00,in_key,false);
  RenX::LadderDatabase::setOutputTimes(SUB81(pLVar1,0));
  ptVar4 = gmtime(&current_time);
  this->last_sorted_month = ptVar4->tm_mon;
  *(code **)&this->field_0xb8 = OnPreUpdateLadder;
  in_key_00._M_str = "ForceDefault";
  in_key_00._M_len = 0xc;
  bVar2 = Jupiter::Config::get<bool>((Config *)this_00,in_key_00,false);
  if (bVar2) {
    RenX::default_ladder_database = pLVar1;
  }
  return true;
}

Assistant:

bool RenX_Ladder_Monthly_TimePlugin::initialize() {
	time_t current_time = time(0);
	// Load database
	this->database.process_file(this->config.get("LadderDatabase"sv, "Ladder.Monthly.db"sv));
	this->database.setName(this->config.get("DatabaseName"sv, "Monthly"sv));
	this->database.setOutputTimes(this->config.get<bool>("OutputTimes"sv, false));

	this->last_sorted_month = gmtime(&current_time)->tm_mon;
	this->database.OnPreUpdateLadder = OnPreUpdateLadder;

	// Force database to default, if desired
	if (this->config.get<bool>("ForceDefault"sv, false)) {
		RenX::default_ladder_database = &this->database;
	}

	return true;
}